

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

void run_container_copy(run_container_t *src,run_container_t *dst)

{
  int iVar1;
  int *in_RSI;
  int *in_RDI;
  int32_t n_runs;
  
  iVar1 = *in_RDI;
  if (in_RSI[1] < *in_RDI) {
    run_container_grow(src,dst._4_4_,dst._3_1_);
  }
  *in_RSI = iVar1;
  memcpy(*(void **)(in_RSI + 2),*(void **)(in_RDI + 2),(long)iVar1 << 2);
  return;
}

Assistant:

void run_container_copy(const run_container_t *src, run_container_t *dst) {
    const int32_t n_runs = src->n_runs;
    if (src->n_runs > dst->capacity) {
        run_container_grow(dst, n_runs, false);
    }
    dst->n_runs = n_runs;
    memcpy(dst->runs, src->runs, sizeof(rle16_t) * n_runs);
}